

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O1

uint32_t cueify_toc_get_track_length(cueify_toc *t,uint8_t track)

{
  uint32_t uVar1;
  cueify_toc *ppvVar2;
  
  uVar1 = 0;
  if (t != (cueify_toc *)0x0) {
    if ((track < *(byte *)t) || (*(byte *)((long)t + 1) <= track)) {
      if (*(uint8_t *)((long)t + 1) != track) {
        return 0;
      }
      ppvVar2 = t + 1;
    }
    else {
      ppvVar2 = t + (ulong)track + 2;
    }
    uVar1 = *(int *)ppvVar2 - *(int *)(t + (ulong)track + 1);
  }
  return uVar1;
}

Assistant:

uint32_t cueify_toc_get_track_length(cueify_toc *t, uint8_t track) {
    cueify_toc_private *toc = (cueify_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track < toc->last_track_number) {
	return toc->tracks[track + 1].lba - toc->tracks[track].lba;
    } else if (track == toc->last_track_number) {
	return toc->tracks[0].lba - toc->tracks[track].lba;
    } else {
	return 0;
    }
}